

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int *piVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  XmlOutput *pXVar6;
  undefined4 in_register_00000034;
  XmlOutput *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  xml_output local_3b8;
  xml_output local_380;
  xml_output local_348;
  xml_output local_310;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  this_00 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar7.m_data = (storage_type *)0xd;
  QVar7.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar7);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar4;
  pXVar6 = XmlOutput::operator<<(this_00,&local_70);
  if (*(long *)((long)__buf + 0x70) == 0) {
    local_a8.xo_type = tNothing;
    local_a8.xo_text.d.d = (Data *)0x0;
    local_a8.xo_text.d.ptr = (char16_t *)0x0;
    local_a8.xo_text.d.size = 0;
    local_a8.xo_value.d.d = (Data *)0x0;
    local_a8.xo_value.d.ptr = (char16_t *)0x0;
    local_a8.xo_value.d.size = 0;
  }
  else {
    QVar8.m_data = (storage_type *)0x4;
    QVar8.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar8);
    local_a8.xo_text.d.size = (qsizetype)local_a8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
    local_a8.xo_type = tAttribute;
    local_a8.xo_text.d.ptr = (char16_t *)local_a8.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.xo_value.d.d = *(Data **)((long)__buf + 0x60);
    local_a8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x68);
    local_a8.xo_value.d.size = *(qsizetype *)((long)__buf + 0x70);
    if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_a8.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_a8);
  if (*(long *)((long)__buf + 0xa0) == 0) {
    local_e0.xo_type = tNothing;
    local_e0.xo_text.d.d = (Data *)0x0;
    local_e0.xo_text.d.ptr = (char16_t *)0x0;
    local_e0.xo_text.d.size = 0;
    local_e0.xo_value.d.d = (Data *)0x0;
    local_e0.xo_value.d.ptr = (char16_t *)0x0;
    local_e0.xo_value.d.size = 0;
  }
  else {
    QVar9.m_data = (storage_type *)0xf;
    QVar9.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar9);
    local_e0.xo_text.d.size = (qsizetype)local_e0.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_e0._4_4_,local_e0.xo_type);
    local_e0.xo_type = tAttribute;
    local_e0.xo_text.d.ptr = (char16_t *)local_e0.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e0.xo_value.d.d = *(Data **)((long)__buf + 0x90);
    local_e0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x98);
    local_e0.xo_value.d.size = *(qsizetype *)((long)__buf + 0xa0);
    if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_e0.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_e0);
  attrT(&local_118,"ATLMinimizesCRunTimeLibraryUsage",*(triState *)((long)__buf + 8));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_118);
  attrT(&local_150,"BuildBrowserInformation",*(triState *)((long)__buf + 0xc));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_150);
  iVar1 = *(int *)((long)__buf + 0x10);
  if (iVar1 == 0) {
    local_188.xo_type = tNothing;
    local_188.xo_text.d.d = (Data *)0x0;
    local_188.xo_text.d.ptr = (char16_t *)0x0;
    local_188.xo_text.d.size = 0;
    local_188.xo_value.d.d = (Data *)0x0;
    local_188.xo_value.d.ptr = (char16_t *)0x0;
    local_188.xo_value.d.size = 0;
  }
  else {
    QVar10.m_data = &DAT_0000000c;
    QVar10.m_size = (qsizetype)&local_188;
    QString::fromUtf8(QVar10);
    pcVar5 = local_188.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_188._4_4_,local_188.xo_type);
    QString::number((int)&local_1c0,iVar1);
    local_188.xo_type = tAttribute;
    local_188.xo_text.d.ptr = (char16_t *)local_188.xo_text.d.d;
    local_188.xo_text.d.size = (qsizetype)pcVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_188.xo_value.d.d = (Data *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    local_188.xo_value.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
    local_188.xo_value.d.size = (qsizetype)local_1c0.xo_text.d.ptr;
    if ((QArrayData *)local_188.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_188.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_188.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    local_188.xo_text.d.d = (Data *)pQVar3;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_188);
  iVar1 = *(int *)((long)__buf + 0x14);
  QVar11.m_data = (storage_type *)0x11;
  QVar11.m_size = (qsizetype)&local_1c0;
  QString::fromUtf8(QVar11);
  pcVar5 = local_1c0.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
  QString::number((int)&local_1f8,iVar1);
  local_1c0.xo_type = tAttribute;
  local_1c0.xo_text.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
  local_1c0.xo_text.d.size = (qsizetype)pcVar5;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1c0.xo_value.d.d = (Data *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
  local_1c0.xo_value.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
  local_1c0.xo_value.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
  if ((QArrayData *)local_1c0.xo_value.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  piVar2 = (int *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
  local_1c0.xo_text.d.d = (Data *)pQVar3;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type),2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_1c0);
  if (*(long *)((long)__buf + 0x28) == 0) {
    local_1f8.xo_type = tNothing;
    local_1f8.xo_text.d.d = (Data *)0x0;
    local_1f8.xo_text.d.ptr = (char16_t *)0x0;
    local_1f8.xo_text.d.size = 0;
    local_1f8.xo_value.d.d = (Data *)0x0;
    local_1f8.xo_value.d.ptr = (char16_t *)0x0;
    local_1f8.xo_value.d.size = 0;
  }
  else {
    QVar12.m_data = (storage_type *)0x17;
    QVar12.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar12);
    local_1f8.xo_text.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    local_1f8.xo_type = tAttribute;
    local_1f8.xo_text.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1f8.xo_value.d.d = *(Data **)((long)__buf + 0x18);
    local_1f8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x20);
    local_1f8.xo_value.d.size = *(qsizetype *)((long)__buf + 0x28);
    if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_1f8.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_1f8);
  if (*(long *)((long)__buf + 0x40) == 0) {
    local_230.xo_type = tNothing;
    local_230.xo_text.d.d = (Data *)0x0;
    local_230.xo_text.d.ptr = (char16_t *)0x0;
    local_230.xo_text.d.size = 0;
    local_230.xo_value.d.d = (Data *)0x0;
    local_230.xo_value.d.ptr = (char16_t *)0x0;
    local_230.xo_value.d.size = 0;
  }
  else {
    QVar13.m_data = (storage_type *)0xd;
    QVar13.m_size = (qsizetype)&local_230;
    QString::fromUtf8(QVar13);
    local_230.xo_text.d.size = (qsizetype)local_230.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type);
    local_230.xo_type = tAttribute;
    local_230.xo_text.d.ptr = (char16_t *)local_230.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_230.xo_value.d.d = *(Data **)((long)__buf + 0x30);
    local_230.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x38);
    local_230.xo_value.d.size = *(qsizetype *)((long)__buf + 0x40);
    if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_230.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_230);
  if (*(long *)((long)__buf + 0x58) == 0) {
    local_268.xo_type = tNothing;
    local_268.xo_text.d.d = (Data *)0x0;
    local_268.xo_text.d.ptr = (char16_t *)0x0;
    local_268.xo_text.d.size = 0;
    local_268.xo_value.d.d = (Data *)0x0;
    local_268.xo_value.d.ptr = (char16_t *)0x0;
    local_268.xo_value.d.size = 0;
  }
  else {
    QVar14.m_data = (storage_type *)0x15;
    QVar14.m_size = (qsizetype)&local_268;
    QString::fromUtf8(QVar14);
    local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_268.xo_type = tAttribute;
    local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_268.xo_value.d.d = *(Data **)((long)__buf + 0x48);
    local_268.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x50);
    local_268.xo_value.d.size = *(qsizetype *)((long)__buf + 0x58);
    if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_268.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_268);
  if (*(long *)((long)__buf + 0xb8) == 0) {
    local_2a0.xo_type = tNothing;
    local_2a0.xo_text.d.d = (Data *)0x0;
    local_2a0.xo_text.d.ptr = (char16_t *)0x0;
    local_2a0.xo_text.d.size = 0;
    local_2a0.xo_value.d.d = (Data *)0x0;
    local_2a0.xo_value.d.ptr = (char16_t *)0x0;
    local_2a0.xo_value.d.size = 0;
  }
  else {
    QVar15.m_data = (storage_type *)0xd;
    QVar15.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar15);
    local_2a0.xo_text.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    local_2a0.xo_type = tAttribute;
    local_2a0.xo_text.d.ptr = (char16_t *)local_2a0.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2a0.xo_value.d.d = *(Data **)((long)__buf + 0xa8);
    local_2a0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xb0);
    local_2a0.xo_value.d.size = *(qsizetype *)((long)__buf + 0xb8);
    if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2a0.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_2a0);
  if (*(long *)((long)__buf + 0xe8) == 0) {
    local_2d8.xo_type = tNothing;
    local_2d8.xo_text.d.d = (Data *)0x0;
    local_2d8.xo_text.d.ptr = (char16_t *)0x0;
    local_2d8.xo_text.d.size = 0;
    local_2d8.xo_value.d.d = (Data *)0x0;
    local_2d8.xo_value.d.ptr = (char16_t *)0x0;
    local_2d8.xo_value.d.size = 0;
  }
  else {
    QVar16.m_data = (storage_type *)0xf;
    QVar16.m_size = (qsizetype)&local_2d8;
    QString::fromUtf8(QVar16);
    local_2d8.xo_text.d.size = (qsizetype)local_2d8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_2d8._4_4_,local_2d8.xo_type);
    local_2d8.xo_type = tAttribute;
    local_2d8.xo_text.d.ptr = (char16_t *)local_2d8.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2d8.xo_value.d.d = *(Data **)((long)__buf + 0xd8);
    local_2d8.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xe0);
    local_2d8.xo_value.d.size = *(qsizetype *)((long)__buf + 0xe8);
    if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2d8.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_2d8);
  attrT(&local_310,"RegisterOutput",*(triState *)((long)__buf + 0x108));
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_310);
  iVar1 = *(int *)((long)__buf + 0x10c);
  if (iVar1 == 0) {
    local_348.xo_type = tNothing;
    local_348.xo_text.d.d = (Data *)0x0;
    local_348.xo_text.d.ptr = (char16_t *)0x0;
    local_348.xo_text.d.size = 0;
    local_348.xo_value.d.d = (Data *)0x0;
    local_348.xo_value.d.ptr = (char16_t *)0x0;
    local_348.xo_value.d.size = 0;
  }
  else {
    QVar17.m_data = &DAT_00000008;
    QVar17.m_size = (qsizetype)&local_348;
    QString::fromUtf8(QVar17);
    pcVar5 = local_348.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type);
    QString::number((int)&local_380,iVar1);
    local_348.xo_type = tAttribute;
    local_348.xo_text.d.ptr = (char16_t *)local_348.xo_text.d.d;
    local_348.xo_text.d.size = (qsizetype)pcVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_348.xo_value.d.d = (Data *)CONCAT44(local_380._4_4_,local_380.xo_type);
    local_348.xo_value.d.ptr = (char16_t *)local_380.xo_text.d.d;
    local_348.xo_value.d.size = (qsizetype)local_380.xo_text.d.ptr;
    if ((QArrayData *)local_348.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_348.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_348.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_380._4_4_,local_380.xo_type);
    local_348.xo_text.d.d = (Data *)pQVar3;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_348);
  iVar1 = *(int *)((long)__buf + 0x110);
  QVar18.m_data = &DAT_00000008;
  QVar18.m_size = (qsizetype)&local_380;
  QString::fromUtf8(QVar18);
  pcVar5 = local_380.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_380._4_4_,local_380.xo_type);
  QString::number((int)&local_3b8,iVar1);
  local_380.xo_type = tAttribute;
  local_380.xo_text.d.ptr = (char16_t *)local_380.xo_text.d.d;
  local_380.xo_text.d.size = (qsizetype)pcVar5;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_380.xo_value.d.d = (Data *)local_3b8._0_8_;
  local_380.xo_value.d.ptr = (char16_t *)local_3b8.xo_text.d.d;
  local_380.xo_value.d.size = (qsizetype)local_3b8.xo_text.d.ptr;
  local_380.xo_text.d.d = (Data *)pQVar3;
  if ((QArrayData *)local_3b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3b8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (((QBasicAtomicInt *)local_3b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3b8._0_8_,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  pXVar6 = XmlOutput::operator<<(pXVar6,&local_380);
  attrT(&local_3b8,"WholeProgramOptimization",*(triState *)((long)__buf + 0x114));
  XmlOutput::operator<<(pXVar6,&local_3b8);
  if (&(local_3b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_380.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_380.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_348.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_348.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_310.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_310.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  (*this->_vptr_VCProjectWriter[4])(this,this_00,(long)__buf + 0x118);
  if (*(int *)((long)__buf + 0x14) == 4) {
    (*this->_vptr_VCProjectWriter[9])(this,this_00,(long)__buf + 0x868);
  }
  else {
    (*this->_vptr_VCProjectWriter[5])(this,this_00,(long)__buf + 0x438);
  }
  (*this->_vptr_VCProjectWriter[6])(this,this_00,(long)__buf + 0x940);
  (*this->_vptr_VCProjectWriter[7])(this,this_00,(long)__buf + 0x950);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xb78);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xc00);
  (*this->_vptr_VCProjectWriter[0xb])(this,this_00,(long)__buf + 0xcd8);
  (*this->_vptr_VCProjectWriter[10])(this,this_00,(long)__buf + 0xd60);
  (*this->_vptr_VCProjectWriter[0xc])(this,this_00,(long)__buf + 0xc88);
  QVar19.m_data = (storage_type *)0xd;
  QVar19.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar19);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tCloseTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar4;
  XmlOutput::operator<<(this_00,&local_70);
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCConfiguration &tool)
{
    xml << tag(_Configuration)
            << attrS(_Name, tool.Name)
            << attrS(_OutputDirectory, tool.OutputDirectory)
            << attrT(_ATLMinimizesCRunTimeLibraryUsage, tool.ATLMinimizesCRunTimeLibraryUsage)
            << attrT(_BuildBrowserInformation, tool.BuildBrowserInformation)
            << attrE(_CharacterSet, tool.CharacterSet, /*ifNot*/ charSetNotSet)
            << attrE(_ConfigurationType, tool.ConfigurationType)
            << attrS(_DeleteExtensionsOnClean, tool.DeleteExtensionsOnClean)
            << attrS(_ImportLibrary, tool.ImportLibrary)
            << attrS(_IntermediateDirectory, tool.IntermediateDirectory)
            << attrS(_PrimaryOutput, tool.PrimaryOutput)
            << attrS(_ProgramDatabase, tool.ProgramDatabase)
            << attrT(_RegisterOutput, tool.RegisterOutput)
            << attrE(_UseOfATL, tool.UseOfATL, /*ifNot*/ useATLNotSet)
            << attrE(_UseOfMfc, tool.UseOfMfc)
            << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization);
    write(xml, tool.compiler);
    if (tool.ConfigurationType == typeStaticLibrary)
        write(xml, tool.librarian);
    else
        write(xml, tool.linker);
    write(xml, tool.manifestTool);
    write(xml, tool.idl);
    write(xml, tool.postBuild);
    write(xml, tool.preBuild);
    write(xml, tool.preLink);
    write(xml, tool.resource);
    write(xml, tool.deployment);
    xml << closetag(_Configuration);
}